

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void zerohyp_val(reg_object obj,double *tval,double *pval)

{
  int df_00;
  double dVar1;
  uint local_28;
  int i;
  int df;
  double *pval_local;
  double *tval_local;
  reg_object obj_local;
  
  df_00 = obj->N - obj->p;
  printf("\n");
  printf("%-25s \n","Zero Hypothesis Test t values and Probabilities (One-tailed)");
  printf("%-25s%-20s%-20s \n","Coefficients","t Value","Probability");
  if (df_00 < 1) {
    printf("degrees of freedom cannot be non-positive");
  }
  else {
    for (local_28 = 0; (int)local_28 < obj->p; local_28 = local_28 + 1) {
      tval[(int)local_28] = ABS(obj->beta[(int)local_28].value) / obj->beta[(int)local_28].stdErr;
      dVar1 = tcdf(ABS(tval[(int)local_28]),df_00);
      pval[(int)local_28] = 1.0 - dVar1;
      printf("B%-25d%-20lf%-20g \n",tval[(int)local_28],SUB84(pval[(int)local_28],0),(ulong)local_28
            );
    }
  }
  return;
}

Assistant:

void zerohyp_val(reg_object obj, double *tval, double *pval) {
	int df, i;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = obj->N - obj->p;
	printf("\n");
	printf("%-25s \n", "Zero Hypothesis Test t values and Probabilities (One-tailed)");
	printf("%-25s%-20s%-20s \n", "Coefficients", "t Value", "Probability");
	if (df > 0) {
		for (i = 0; i < obj->p; ++i) {
			tval[i] = fabs((obj->beta + i)->value) / (obj->beta + i)->stdErr;
			pval[i] = 1.0 - tcdf(fabs(tval[i]), df);
			printf("B%-25d%-20lf%-20g \n", i, tval[i], pval[i]);
		}
	}
	else {
		printf("degrees of freedom cannot be non-positive");
	}
}